

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ThreadSafeArena::Init(ThreadSafeArena *this)

{
  LogMessage *other;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *in_FS_OFFSET;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar3 = (uint)*(undefined8 *)this & 1;
  uVar1 = *(ulong *)*in_FS_OFFSET;
  uVar2 = uVar3;
  if ((uVar1 & 0x1ff) == 0) {
    LOCK();
    UNLOCK();
    uVar1 = lifecycle_id_generator_ << 9;
    uVar2 = (uint)*(undefined8 *)this & 1;
    lifecycle_id_generator_ = lifecycle_id_generator_ + 1;
  }
  *(ulong *)*in_FS_OFFSET = uVar1 + 2;
  *(ulong *)this = uVar2 | uVar1;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  if ((byte)uVar3 != ((byte)(uVar2 | uVar1) & 1)) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x139);
    other = LogMessage::operator<<
                      (&local_48,"CHECK failed: (was_message_owned) == (IsMessageOwned()): ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void ThreadSafeArena::Init() {
#ifndef NDEBUG
  const bool was_message_owned = IsMessageOwned();
#endif  // NDEBUG
  ThreadCache& tc = thread_cache();
  auto id = tc.next_lifecycle_id;
  // We increment lifecycle_id's by multiples of two so we can use bit 0 as
  // a tag.
  constexpr uint64_t kDelta = 2;
  constexpr uint64_t kInc = ThreadCache::kPerThreadIds * kDelta;
  if (PROTOBUF_PREDICT_FALSE((id & (kInc - 1)) == 0)) {
    constexpr auto relaxed = std::memory_order_relaxed;
    // On platforms that don't support uint64_t atomics we can certainly not
    // afford to increment by large intervals and expect uniqueness due to
    // wrapping, hence we only add by 1.
    id = lifecycle_id_generator_.id.fetch_add(1, relaxed) * kInc;
  }
  tc.next_lifecycle_id = id + kDelta;
  // Message ownership is stored in tag_and_id_, and is set in the constructor.
  // This flag bit must be preserved, even across calls to Reset().
  tag_and_id_ = id | (tag_and_id_ & kMessageOwnedArena);
  hint_.store(nullptr, std::memory_order_relaxed);
  threads_.store(nullptr, std::memory_order_relaxed);
#ifndef NDEBUG
  GOOGLE_CHECK_EQ(was_message_owned, IsMessageOwned());
#endif  // NDEBUG
}